

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::IsSafeToTransferInPrePass(GlobOpt *this,Opnd *src,Value *srcValue)

{
  StackSym *pSVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  StackSym *pSVar4;
  int32 local_2c [2];
  int32 srcIntConstantValue;
  
  bVar2 = IR::Opnd::IsRegOpnd(src);
  if (bVar2) {
    pRVar3 = IR::Opnd::AsRegOpnd(src);
    pSVar1 = pRVar3->m_sym;
    if ((pSVar1->field_0x1a & 4) != 0) {
      return true;
    }
    bVar2 = ValueInfo::TryGetIntConstantValue(srcValue->valueInfo,local_2c,false);
    if ((bVar2) && (pSVar4 = GetTaggedIntConstantStackSym(this,local_2c[0]), pSVar4 == pSVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsSafeToTransferInPrePass(IR::Opnd *src, Value *srcValue)
{
    if (src->IsRegOpnd())
    {
        StackSym *srcSym = src->AsRegOpnd()->m_sym;
        if (srcSym->IsFromByteCodeConstantTable())
        {
            return true;
        }

        ValueInfo *srcValueInfo = srcValue->GetValueInfo();

        int32 srcIntConstantValue;
        if (srcValueInfo->TryGetIntConstantValue(&srcIntConstantValue) && !Js::TaggedInt::IsOverflow(srcIntConstantValue)
            && GetTaggedIntConstantStackSym(srcIntConstantValue) == srcSym)
        {
            return true;
        }
    }

    return false;
}